

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::AccessorPrimitiveFieldGenerator::GenerateHashCodeCode
          (AccessorPrimitiveFieldGenerator *this,Printer *printer)

{
  JavaType JVar1;
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  AccessorPrimitiveFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  JVar1 = GetJavaType(this->descriptor_);
  switch(JVar1) {
  case JAVATYPE_INT:
    io::Printer::Print(local_18,&this->variables_,"result = 31 * result + $name$_;\n");
    break;
  case JAVATYPE_LONG:
    io::Printer::Print(local_18,&this->variables_,
                       "result = 31 * result + (int) ($name$_ ^ ($name$_ >>> 32));\n");
    break;
  case JAVATYPE_FLOAT:
    io::Printer::Print(local_18,&this->variables_,
                       "result = 31 * result +\n    java.lang.Float.floatToIntBits($name$_);\n");
    break;
  case JAVATYPE_DOUBLE:
    io::Printer::Print(local_18,&this->variables_,
                       "{\n  long v = java.lang.Double.doubleToLongBits($name$_);\n  result = 31 * result + (int) (v ^ (v >>> 32));\n}\n"
                      );
    break;
  case JAVATYPE_BOOLEAN:
    io::Printer::Print(local_18,&this->variables_,
                       "result = 31 * result + ($name$_ ? 1231 : 1237);\n");
    break;
  case JAVATYPE_STRING:
    io::Printer::Print(local_18,&this->variables_,"result = 31 * result + $name$_.hashCode();\n");
    break;
  case JAVATYPE_BYTES:
    io::Printer::Print(local_18,&this->variables_,
                       "result = 31 * result + java.util.Arrays.hashCode($name$_);\n");
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
               ,0x2b1);
    other = internal::LogMessage::operator<<(&local_50,"unknown java type for primitive field");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  return;
}

Assistant:

void AccessorPrimitiveFieldGenerator::
GenerateHashCodeCode(io::Printer* printer) const {
  switch (GetJavaType(descriptor_)) {
    // For all Java primitive types below, the hash codes match the
    // results of BoxedType.valueOf(primitiveValue).hashCode().
    case JAVATYPE_INT:
      printer->Print(variables_,
        "result = 31 * result + $name$_;\n");
      break;
    case JAVATYPE_LONG:
      printer->Print(variables_,
        "result = 31 * result + (int) ($name$_ ^ ($name$_ >>> 32));\n");
      break;
    case JAVATYPE_FLOAT:
      printer->Print(variables_,
        "result = 31 * result +\n"
        "    java.lang.Float.floatToIntBits($name$_);\n");
      break;
    case JAVATYPE_DOUBLE:
      printer->Print(variables_,
        "{\n"
        "  long v = java.lang.Double.doubleToLongBits($name$_);\n"
        "  result = 31 * result + (int) (v ^ (v >>> 32));\n"
        "}\n");
      break;
    case JAVATYPE_BOOLEAN:
      printer->Print(variables_,
        "result = 31 * result + ($name$_ ? 1231 : 1237);\n");
      break;
    case JAVATYPE_STRING:
      // Accessor style would guarantee $name$_ non-null
      printer->Print(variables_,
        "result = 31 * result + $name$_.hashCode();\n");
      break;
    case JAVATYPE_BYTES:
      // Accessor style would guarantee $name$_ non-null
      printer->Print(variables_,
        "result = 31 * result + java.util.Arrays.hashCode($name$_);\n");
      break;
    default:
      GOOGLE_LOG(ERROR) << "unknown java type for primitive field";
      break;
  }
}